

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_channeldata.h
# Opt level: O0

CscPrefixMapItem *
CscPrefixMap_find(CscPrefixMapItem *mapl,int maxSize,char *cname,size_t prefixlen)

{
  int iVar1;
  size_t in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  int idx;
  int local_24;
  
  local_24 = 0;
  do {
    if (in_ESI <= local_24) {
LAB_00a62659:
      return (CscPrefixMapItem *)(in_RDI + (long)local_24 * 0x20);
    }
    if (*(long *)(in_RDI + (long)local_24 * 0x20) == 0) {
      *(char **)(in_RDI + (long)local_24 * 0x20) = in_RDX;
      *(size_t *)(in_RDI + (long)local_24 * 0x20 + 8) = in_RCX;
      *(undefined4 *)(in_RDI + (long)local_24 * 0x20 + 0x10) = 0xffffffff;
      *(undefined4 *)(in_RDI + (long)local_24 * 0x20 + 0x14) = 0xffffffff;
      *(undefined4 *)(in_RDI + (long)local_24 * 0x20 + 0x18) = 0xffffffff;
      goto LAB_00a62659;
    }
    if ((in_RCX == *(size_t *)(in_RDI + (long)local_24 * 0x20 + 8)) &&
       (iVar1 = strncmp(in_RDX,*(char **)(in_RDI + (long)local_24 * 0x20),in_RCX), iVar1 == 0))
    goto LAB_00a62659;
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static inline CscPrefixMapItem*
CscPrefixMap_find (
    CscPrefixMapItem* mapl, int maxSize, const char* cname, size_t prefixlen)
{
    int idx = 0;
    for (; idx < maxSize; ++idx)
    {
        if (mapl[idx].name == NULL)
        {
            mapl[idx].name       = cname;
            mapl[idx].prefix_len = prefixlen;
            mapl[idx].idx[0]     = -1;
            mapl[idx].idx[1]     = -1;
            mapl[idx].idx[2]     = -1;
            break;
        }

        if (prefixlen == mapl[idx].prefix_len &&
            !strncmp (cname, mapl[idx].name, prefixlen))
        {
            break;
        }
    }

    return mapl + idx;
}